

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateClearingCode
          (SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    if (this->opts_->experimental_use_micro_string == true) {
      pcVar2 = "\n        if (GetArena() == nullptr) $field_$.Destroy();\n      ";
      uVar1 = 0x3e;
    }
    else {
      pcVar2 = "\n      $field_$.Destroy();\n    ";
      uVar1 = 0x1f;
    }
  }
  else if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_
           == (string *)0x0) {
    if (this->opts_->experimental_use_micro_string == true) {
      pcVar2 = "\n        $field_$.Clear();\n      ";
      uVar1 = 0x21;
    }
    else {
      pcVar2 = "\n      $field_$.ClearToEmpty();\n    ";
      uVar1 = 0x24;
    }
  }
  else {
    if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
      cpp::(anonymous_namespace)::SingularStringView::GenerateClearingCode();
    }
    pcVar2 = "\n    $field_$.ClearToDefault($lazy_var$, GetArena());\n  ";
    uVar1 = 0x38;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void SingularStringView::GenerateClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        if (GetArena() == nullptr) $field_$.Destroy();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  if (EmptyDefault()) {
    if (use_micro_string()) {
      p->Emit(R"cc(
        $field_$.Clear();
      )cc");
      return;
    }
    p->Emit(R"cc(
      $field_$.ClearToEmpty();
    )cc");
    return;
  }

  ABSL_DCHECK(!is_inlined());
  p->Emit(R"cc(
    $field_$.ClearToDefault($lazy_var$, GetArena());
  )cc");
}